

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase434::run(TestCase434 *this)

{
  TaskSet **this_00;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  nfds_t __nfds;
  nfds_t __nfds_00;
  pollfd *ppVar5;
  bool local_1271;
  bool _kj_shouldLog_1;
  Fault f_2;
  SyscallResult local_124c [2];
  SyscallResult _kjSyscallResult_2;
  char buffer [4096];
  bool local_23a;
  char local_239;
  bool _kj_shouldLog;
  undefined1 *puStack_238;
  undefined1 local_230 [40];
  Promise<void> promise;
  bool writable;
  Fault f_1;
  SyscallResult local_1dc;
  undefined1 auStack_1d8 [4];
  SyscallResult _kjSyscallResult_1;
  ssize_t n;
  FdObserver observer;
  AutoCloseFd outfd;
  AutoCloseFd infd;
  Fault f;
  SyscallResult local_154;
  undefined1 local_150 [4];
  SyscallResult _kjSyscallResult;
  int pipefds [2];
  WaitScope waitScope;
  undefined1 local_128 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase434 *this_local;
  
  captureSignals();
  this_00 = &loop.daemons.ptr;
  UnixEventPort::UnixEventPort((UnixEventPort *)this_00);
  EventLoop::EventLoop((EventLoop *)local_128,(EventPort *)this_00);
  WaitScope::WaitScope((WaitScope *)pipefds,(EventLoop *)local_128);
  f.exception = (Exception *)local_150;
  local_154 = _::Debug::syscall<kj::(anonymous_namespace)::TestCase434::run()::__0>
                        ((anon_class_8_1_619ab5e7 *)&f,false);
  pvVar3 = _::Debug::SyscallResult::operator_cast_to_void_(&local_154);
  if (pvVar3 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_154);
    _::Debug::Fault::Fault
              ((Fault *)&infd,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1b9,iVar1,"pipe(pipefds)","");
    _::Debug::Fault::fatal((Fault *)&infd);
  }
  AutoCloseFd::AutoCloseFd(&outfd,(int)local_150);
  AutoCloseFd::AutoCloseFd((AutoCloseFd *)&observer.atEnd,_kjSyscallResult.errorNumber);
  iVar1 = AutoCloseFd::operator_cast_to_int((AutoCloseFd *)&observer.atEnd);
  setNonblocking(iVar1);
  iVar1 = AutoCloseFd::operator_cast_to_int(&outfd);
  setNonblocking(iVar1);
  iVar1 = AutoCloseFd::operator_cast_to_int((AutoCloseFd *)&observer.atEnd);
  UnixEventPort::FdObserver::FdObserver((FdObserver *)&n,(UnixEventPort *)&loop.daemons.ptr,iVar1,2)
  ;
  do {
    f_1.exception = (Exception *)auStack_1d8;
    local_1dc = _::Debug::syscall<kj::(anonymous_namespace)::TestCase434::run()::__1>
                          ((anon_class_16_2_8f6e5347 *)&f_1,true);
    pvVar3 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1dc);
    if (pvVar3 == (void *)0x0) {
      iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_1dc);
      _::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffe08,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x1c3,iVar1,"n = write(outfd, \"foo\", 3)","");
      _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe08);
    }
  } while (-1 < (long)_auStack_1d8);
  promise.super_PromiseBase.node.ptr._7_1_ = 0;
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_230);
  puStack_238 = (undefined1 *)((long)&promise.super_PromiseBase.node.ptr + 7);
  pcVar4 = &local_239;
  Promise<void>::then<kj::(anonymous_namespace)::TestCase434::run()::__2,kj::_::PropagateException>
            ((Promise<void> *)(local_230 + 0x10),(Type *)local_230,
             (PropagateException *)&stack0xfffffffffffffdc8);
  Promise<void>::eagerlyEvaluate((Promise<void> *)(local_230 + 0x20),local_230 + 0x10);
  Promise<void>::~Promise((Promise<void> *)(local_230 + 0x10));
  Promise<void>::~Promise((Promise<void> *)local_230);
  uVar2 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  ppVar5 = (pollfd *)(ulong)uVar2;
  EventLoop::run((EventLoop *)local_128,uVar2);
  UnixEventPort::poll((UnixEventPort *)&loop.daemons.ptr,ppVar5,__nfds,(int)pcVar4);
  uVar2 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  EventLoop::run((EventLoop *)local_128,uVar2);
  if ((promise.super_PromiseBase.node.ptr._7_1_ & 1) != 0) {
    local_23a = _::Debug::shouldLog(ERROR);
    while (local_23a != false) {
      pcVar4 = "\"failed: expected \" \"!(writable)\"";
      _::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x1ce,ERROR,"\"failed: expected \" \"!(writable)\"",
                 (char (*) [29])"failed: expected !(writable)");
      local_23a = false;
    }
  }
  do {
    f_2.exception = (Exception *)auStack_1d8;
    local_124c[0] =
         _::Debug::syscall<kj::(anonymous_namespace)::TestCase434::run()::__3>
                   ((anon_class_24_3_eca8b9b4 *)&f_2,true);
    pvVar3 = _::Debug::SyscallResult::operator_cast_to_void_(local_124c);
    iVar1 = (int)pcVar4;
    if (pvVar3 == (void *)0x0) {
      iVar1 = _::Debug::SyscallResult::getErrorNumber(local_124c);
      _::Debug::Fault::Fault
                ((Fault *)&stack0xffffffffffffed90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x1d6,iVar1,"n = read(infd, &buffer, sizeof(buffer))","");
      _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffed90);
    }
  } while (0 < (long)_auStack_1d8);
  uVar2 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  ppVar5 = (pollfd *)(ulong)uVar2;
  EventLoop::run((EventLoop *)local_128,uVar2);
  UnixEventPort::poll((UnixEventPort *)&loop.daemons.ptr,ppVar5,__nfds_00,iVar1);
  uVar2 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  EventLoop::run((EventLoop *)local_128,uVar2);
  if ((promise.super_PromiseBase.node.ptr._7_1_ & 1) == 0) {
    local_1271 = _::Debug::shouldLog(ERROR);
    while (local_1271 != false) {
      _::Debug::log<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x1dd,ERROR,"\"failed: expected \" \"writable\"",
                 (char (*) [26])"failed: expected writable");
      local_1271 = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)(local_230 + 0x20));
  UnixEventPort::FdObserver::~FdObserver((FdObserver *)&n);
  AutoCloseFd::~AutoCloseFd((AutoCloseFd *)&observer.atEnd);
  AutoCloseFd::~AutoCloseFd(&outfd);
  WaitScope::~WaitScope((WaitScope *)pipefds);
  EventLoop::~EventLoop((EventLoop *)local_128);
  UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.daemons.ptr);
  return;
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  kj::AutoCloseFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096];
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}